

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_external.cpp
# Opt level: O3

void duckdb::RowOperations::SwizzleColumns(RowLayout *layout,data_ptr_t base_row_ptr,idx_t count)

{
  PhysicalType type;
  idx_t iVar1;
  bool bVar2;
  long *plVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type __n;
  idx_t iVar9;
  data_ptr_t heap_row_ptrs [2048];
  long alStack_4038 [2049];
  
  if (count != 0) {
    iVar1 = layout->row_width;
    iVar9 = 0;
    do {
      uVar6 = count - iVar9;
      if (0x7ff < uVar6) {
        uVar6 = 0x800;
      }
      if (count != iVar9) {
        plVar3 = (long *)(base_row_ptr + layout->heap_pointer_offset + iVar9 * iVar1);
        lVar8 = 0;
        do {
          alStack_4038[lVar8] = *plVar3;
          plVar3 = (long *)((long)plVar3 + iVar1);
          lVar8 = lVar8 + 1;
        } while (uVar6 + (uVar6 == 0) != lVar8);
      }
      if ((layout->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (layout->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar8 = uVar6 + (uVar6 == 0);
        __n = 0;
        do {
          pvVar4 = vector<duckdb::LogicalType,_true>::operator[](&layout->types,__n);
          type = pvVar4->physical_type_;
          bVar2 = TypeIsConstantSize(type);
          if (!bVar2) {
            pvVar5 = vector<unsigned_long,_true>::operator[](&layout->offsets,__n);
            plVar3 = (long *)(base_row_ptr + *pvVar5 + iVar9 * iVar1);
            if (type == VARCHAR) {
              if (count != iVar9) {
                plVar3 = plVar3 + 1;
                lVar7 = 0;
                do {
                  if (0xc < *(uint *)(plVar3 + -1)) {
                    *plVar3 = *plVar3 - alStack_4038[lVar7];
                  }
                  plVar3 = (long *)((long)plVar3 + iVar1);
                  lVar7 = lVar7 + 1;
                } while (lVar8 != lVar7);
              }
            }
            else if (count != iVar9) {
              lVar7 = 0;
              do {
                *plVar3 = *plVar3 - alStack_4038[lVar7];
                plVar3 = (long *)((long)plVar3 + iVar1);
                lVar7 = lVar7 + 1;
              } while (lVar8 != lVar7);
            }
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(layout->types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(layout->types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
      }
      iVar9 = iVar9 + uVar6;
    } while (iVar9 != count);
  }
  return;
}

Assistant:

void RowOperations::SwizzleColumns(const RowLayout &layout, const data_ptr_t base_row_ptr, const idx_t count) {
	const idx_t row_width = layout.GetRowWidth();
	data_ptr_t heap_row_ptrs[STANDARD_VECTOR_SIZE];
	idx_t done = 0;
	while (done != count) {
		const idx_t next = MinValue<idx_t>(count - done, STANDARD_VECTOR_SIZE);
		const data_ptr_t row_ptr = base_row_ptr + done * row_width;
		// Load heap row pointers
		data_ptr_t heap_ptr_ptr = row_ptr + layout.GetHeapOffset();
		for (idx_t i = 0; i < next; i++) {
			heap_row_ptrs[i] = Load<data_ptr_t>(heap_ptr_ptr);
			heap_ptr_ptr += row_width;
		}
		// Loop through the blob columns
		for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
			auto physical_type = layout.GetTypes()[col_idx].InternalType();
			if (TypeIsConstantSize(physical_type)) {
				continue;
			}
			data_ptr_t col_ptr = row_ptr + layout.GetOffsets()[col_idx];
			if (physical_type == PhysicalType::VARCHAR) {
				data_ptr_t string_ptr = col_ptr + string_t::HEADER_SIZE;
				for (idx_t i = 0; i < next; i++) {
					if (Load<uint32_t>(col_ptr) > string_t::INLINE_LENGTH) {
						// Overwrite the string pointer with the within-row offset (if not inlined)
						Store<idx_t>(UnsafeNumericCast<idx_t>(Load<data_ptr_t>(string_ptr) - heap_row_ptrs[i]),
						             string_ptr);
					}
					col_ptr += row_width;
					string_ptr += row_width;
				}
			} else {
				// Non-varchar blob columns
				for (idx_t i = 0; i < next; i++) {
					// Overwrite the column data pointer with the within-row offset
					Store<idx_t>(UnsafeNumericCast<idx_t>(Load<data_ptr_t>(col_ptr) - heap_row_ptrs[i]), col_ptr);
					col_ptr += row_width;
				}
			}
		}
		done += next;
	}
}